

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestDyndepLoadMissingEntry::Run(GraphTestDyndepLoadMissingEntry *this)

{
  Test *pTVar1;
  bool bVar2;
  Node *pNVar3;
  string err;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "rule r\n  command = unused\nbuild out: r in || dd\n  dyndep = dd\n",
              (ManifestParserOptions)0x0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"dd",&local_62);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"ninja_dyndep_version = 1\n",&local_61);
  VirtualFileSystem::Create(&(this->super_GraphTest).fs_,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pTVar1 = g_current_test;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dd",&local_62);
  pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
  bVar2 = testing::Test::Check
                    (pTVar1,pNVar3->dyndep_pending_,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
                     ,0x25c,"GetNode(\"dd\")->dyndep_pending()");
  std::__cxx11::string::~string((string *)&local_60);
  pTVar1 = g_current_test;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dd",&local_62);
    pNVar3 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_60);
    bVar2 = DependencyScan::LoadDyndeps(&(this->super_GraphTest).scan_,pNVar3,&local_40);
    testing::Test::Check
              (pTVar1,!bVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x25d,"scan_.LoadDyndeps(GetNode(\"dd\"), &err)");
    std::__cxx11::string::~string((string *)&local_60);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("\'out\' not mentioned in its dyndep file \'dd\'",&local_40);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/graph_test.cc"
               ,0x25e,"\"\'out\' not mentioned in its dyndep file \'dd\'\" == err");
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

TEST_F(GraphTest, DyndepLoadMissingEntry) {
  AssertParse(&state_,
"rule r\n"
"  command = unused\n"
"build out: r in || dd\n"
"  dyndep = dd\n"
  );
  fs_.Create("dd",
"ninja_dyndep_version = 1\n"
  );

  string err;
  ASSERT_TRUE(GetNode("dd")->dyndep_pending());
  EXPECT_FALSE(scan_.LoadDyndeps(GetNode("dd"), &err));
  EXPECT_EQ("'out' not mentioned in its dyndep file 'dd'", err);
}